

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O3

bool __thiscall crnlib::etc1_optimizer::compute(etc1_optimizer *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  params *ppVar10;
  results *prVar11;
  uchar *__src;
  undefined1 auVar12 [16];
  int iVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint refinement_trial;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  uint uVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar35;
  undefined1 auVar33 [16];
  int iVar36;
  undefined1 auVar34 [16];
  int iVar37;
  float fVar38;
  float fVar39;
  int iVar41;
  float fVar42;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  etc1_solution_coordinates coords1;
  etc1_solution_coordinates coords;
  uint local_c0;
  uint local_bc;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_b8;
  undefined4 local_b4;
  undefined1 local_b0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_ac;
  undefined4 local_a8;
  undefined1 local_a4;
  potential_solution *local_a0;
  potential_solution *local_98;
  long local_90;
  long local_88;
  long local_80;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  uint local_64;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_40;
  
  uVar7 = this->m_pParams->m_num_src_pixels;
  local_80 = (long)(int)this->m_pParams->m_scan_delta_size;
  if (0 < local_80) {
    local_98 = &this->m_trial_solution;
    local_a0 = &this->m_best_solution;
    local_58 = (float)uVar7;
    uStack_40 = 0;
    local_90 = 0;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    local_48 = local_58;
    do {
      local_74 = this->m_pParams->m_pScan_deltas[local_90];
      uVar17 = this->m_bb + local_74;
      if (-1 < (int)uVar17) {
        if (this->m_limit < (int)uVar17) break;
        local_70 = 0xff;
        if (uVar17 < 0xff) {
          local_70 = uVar17;
        }
        local_88 = 0;
        do {
          iVar13 = local_74;
          iVar8 = this->m_pParams->m_pScan_deltas[local_88];
          uVar18 = this->m_bg + iVar8;
          if (-1 < (int)uVar18) {
            if (this->m_limit < (int)uVar18) break;
            local_6c = 0xff;
            if (uVar18 < 0xff) {
              local_6c = uVar18;
            }
            lVar25 = 0;
            do {
              ppVar10 = this->m_pParams;
              iVar21 = ppVar10->m_pScan_deltas[lVar25];
              uVar26 = this->m_br + iVar21;
              if (-1 < (int)uVar26) {
                if (this->m_limit < (int)uVar26) break;
                local_a4 = ppVar10->m_use_color4;
                uVar22 = 0xff;
                if (uVar26 < 0xff) {
                  uVar22 = uVar26;
                }
                local_ac.field_0.r = (uchar)uVar22;
                local_ac.field_0.g = (uchar)local_6c;
                local_ac.field_0.b = (uchar)local_70;
                local_ac.field_0.a = 0xff;
                local_a8 = 0;
                local_60 = lVar25;
                if ((ppVar10->super_crn_etc1_pack_params).m_quality == cCRNETCQualitySlow) {
                  bVar14 = evaluate_solution(this,(etc1_solution_coordinates *)&local_ac.field_0,
                                             local_98,local_a0);
                }
                else {
                  bVar14 = evaluate_solution_fast
                                     (this,(etc1_solution_coordinates *)&local_ac.field_0,local_98,
                                      local_a0);
                }
                lVar25 = local_60;
                if (bVar14 != false) {
                  bVar14 = iVar21 == 0 && (iVar8 == 0 && iVar13 == 0);
                  local_68 = bVar14 + 2 + (uint)bVar14;
                  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality == cCRNETCQualityFast)
                  {
                    local_68 = 2;
                  }
                  iVar21 = 0;
                  while( true ) {
                    bVar4 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
                    local_64 = (uint)bVar4;
                    if ((this->m_best_solution).m_coords.m_color4 == true) {
                      bVar5 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
                      auVar33._0_4_ = (uint)bVar4 << 4;
                      auVar33._4_4_ = (uint)bVar5 << 4;
                      auVar33._8_8_ = 0;
                      auVar33 = auVar33 | ZEXT516(CONCAT14(bVar5,(uint)bVar4));
                      bVar4 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
                      local_c0 = (uint)bVar4;
                      uVar22 = local_c0 << 4;
                    }
                    else {
                      bVar5 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
                      auVar27._0_4_ = local_64 << 3;
                      auVar27._4_4_ = (uint)bVar5 << 3;
                      auVar27._8_8_ = 0;
                      auVar33 = auVar27 | ZEXT516(CONCAT14(bVar5 >> 2,(uint)(bVar4 >> 2)));
                      bVar6 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
                      local_c0 = (uint)bVar6;
                      bVar4 = bVar6 >> 2;
                      uVar22 = (uint)bVar6 << 3;
                    }
                    local_bc = (uint)bVar5;
                    uVar15 = (uint)bVar4;
                    uVar32 = uVar22 | uVar15;
                    if (0xfe < (uVar22 | uVar15)) {
                      uVar32 = 0xff;
                    }
                    if (uVar7 == 0) {
                      iVar24 = 0;
                      iVar37 = 0;
                      iVar41 = 0;
                      iVar35 = 0;
                      iVar36 = 0;
                    }
                    else {
                      auVar27 = auVar33 ^ _DAT_001a7020;
                      auVar28._0_4_ = -(uint)(-0x7fffff02 < auVar27._0_4_);
                      auVar28._4_4_ = -(uint)(-0x7fffff02 < auVar27._4_4_);
                      auVar28._8_4_ = -(uint)(0 < auVar27._8_4_);
                      auVar28._12_4_ = -(uint)(0 < auVar27._12_4_);
                      auVar29._0_4_ = auVar28._0_4_ >> 0x18;
                      auVar29._4_4_ = auVar28._4_4_ >> 0x18;
                      auVar29._8_4_ = auVar28._8_4_ >> 0x18;
                      auVar29._12_4_ = auVar28._12_4_ >> 0x18;
                      auVar29 = auVar29 | ~auVar28 & auVar33;
                      iVar37 = 0;
                      iVar41 = 0;
                      iVar35 = 0;
                      iVar36 = 0;
                      lVar25 = 0;
                      iVar24 = 0;
                      do {
                        iVar9 = (&g_etc1_inten_tables)
                                [(ulong)(this->m_best_solution).m_coords.m_inten_table * 4 +
                                 (ulong)(this->m_best_solution).m_selectors.m_p[lVar25]];
                        uVar22 = iVar9 + auVar29._0_4_;
                        uVar20 = 0xff;
                        if (0xfe < (int)uVar22) {
                          uVar22 = uVar20;
                        }
                        if ((int)uVar22 < 1) {
                          uVar22 = 0;
                        }
                        uVar15 = iVar9 + auVar29._4_4_;
                        if (0xfe < (int)uVar15) {
                          uVar15 = uVar20;
                        }
                        if ((int)uVar15 < 1) {
                          uVar15 = 0;
                        }
                        uVar19 = iVar9 + uVar32;
                        if (0xfe < (int)(iVar9 + uVar32)) {
                          uVar19 = uVar20;
                        }
                        if ((int)uVar19 < 1) {
                          uVar19 = 0;
                        }
                        iVar35 = iVar35 - auVar29._8_4_;
                        iVar36 = iVar36 - auVar29._12_4_;
                        iVar37 = uVar22 + (iVar37 - auVar29._0_4_);
                        iVar41 = uVar15 + (iVar41 - auVar29._4_4_);
                        iVar24 = (iVar24 - uVar32) + uVar19;
                        lVar25 = lVar25 + 1;
                      } while (uVar7 != (uint)lVar25);
                    }
                    auVar30._0_4_ = -(uint)(iVar37 == 0);
                    auVar30._4_4_ = -(uint)(iVar37 == 0);
                    auVar30._8_4_ = -(uint)(iVar41 == 0);
                    auVar30._12_4_ = -(uint)(iVar41 == 0);
                    uVar22 = movmskpd(uVar15,auVar30);
                    lVar25 = local_60;
                    if (((((uVar22 ^ 3) & 1) == 0) && ((byte)((byte)(uVar22 ^ 3) >> 1) == 0)) &&
                       (iVar24 == 0)) break;
                    auVar43._0_4_ = (float)iVar37;
                    auVar43._4_4_ = (float)iVar41;
                    auVar43._8_4_ = (float)iVar35;
                    auVar43._12_4_ = (float)iVar36;
                    auVar12._4_4_ = fStack_54;
                    auVar12._0_4_ = local_58;
                    auVar12._8_4_ = fStack_50;
                    auVar12._12_4_ = fStack_4c;
                    auVar27 = divps(auVar43,auVar12);
                    uVar22 = this->m_limit;
                    fVar38 = (float)(int)uVar22;
                    uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
                    auVar40._0_4_ = fVar38 * ((float)uVar2 - auVar27._0_4_);
                    auVar40._4_4_ = fVar38 * ((float)((ulong)uVar2 >> 0x20) - auVar27._4_4_);
                    auVar40._8_4_ = fVar38 * (0.0 - auVar27._8_4_);
                    auVar40._12_4_ = fVar38 * (0.0 - auVar27._12_4_);
                    auVar27 = divps(auVar40,_DAT_001b0400);
                    fVar39 = auVar27._0_4_ + 0.5;
                    fVar42 = auVar27._4_4_ + 0.5;
                    uVar15 = (uint)fVar39;
                    uVar32 = (uint)fVar42;
                    uVar15 = (int)(fVar39 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
                    uVar32 = (int)(fVar42 - 2.1474836e+09) & (int)uVar32 >> 0x1f | uVar32;
                    auVar31._0_4_ =
                         ~-(uint)((int)uVar15 < 0) &
                         (~-(uint)((int)uVar15 < (int)uVar22) & uVar22 |
                         uVar15 & -(uint)((int)uVar15 < (int)uVar22));
                    uVar15 = ~-(uint)((int)uVar32 < 0) &
                             (~-(uint)((int)uVar32 < (int)uVar22) & uVar22 |
                             uVar32 & -(uint)((int)uVar32 < (int)uVar22));
                    uVar16 = (ulong)((((this->m_avg_color).m_s[2] - (float)iVar24 / local_48) *
                                     fVar38) / 255.0 + 0.5);
                    iVar24 = (int)uVar16;
                    uVar23 = (ulong)uVar22;
                    if (iVar24 < (int)uVar22) {
                      uVar23 = uVar16 & 0xffffffff;
                    }
                    if (iVar24 < 0) {
                      uVar23 = 0;
                    }
                    uVar22 = (uint)uVar23;
                    if ((((uVar26 == auVar31._0_4_) && (uVar18 == uVar15)) && (uVar17 == uVar22)) ||
                       (((uVar32 = 0, auVar31._0_4_ == local_64 &&
                         (uVar32 = local_bc, uVar15 == local_bc)) &&
                        (uVar32 = local_c0, uVar22 == local_c0)))) break;
                    uVar1 = this->m_br;
                    uVar3 = this->m_bg;
                    auVar34._0_4_ = -(uint)(uVar1 == auVar31._0_4_);
                    auVar34._4_4_ = auVar34._0_4_;
                    auVar34._8_4_ = -(uint)(uVar3 == uVar15);
                    auVar34._12_4_ = -(uint)(uVar3 == uVar15);
                    uVar32 = movmskpd(uVar32,auVar34);
                    if ((((uVar32 & 1) != 0) && ((byte)((byte)uVar32 >> 1) != 0)) &&
                       (this->m_bb == uVar22)) break;
                    local_b0 = this->m_pParams->m_use_color4;
                    auVar31._4_4_ = auVar31._0_4_;
                    auVar31._8_4_ = uVar15;
                    auVar31._12_4_ = uVar15;
                    uVar20 = movmskpd(uVar26,auVar31);
                    uVar32 = auVar31._0_4_;
                    if (0xfe < auVar31._0_4_) {
                      uVar32 = 0xff;
                    }
                    local_b8.field_0.r = (uchar)uVar32;
                    if ((uVar20 & 1) != 0) {
                      local_b8.field_0.r = '\0';
                    }
                    if (0xfe < uVar15) {
                      uVar15 = 0xff;
                    }
                    local_b8.field_0.g = (uchar)uVar15;
                    if ((uVar20 & 2) != 0) {
                      local_b8.field_0.g = '\0';
                    }
                    uVar16 = 0xff;
                    if (uVar22 < 0xff) {
                      uVar16 = uVar23;
                    }
                    local_b8.field_0.b = (uchar)uVar16;
                    if ((int)uVar22 < 0) {
                      local_b8.field_0.b = '\0';
                    }
                    local_b8.field_0.a = 0xff;
                    local_b4 = 0;
                    if ((this->m_pParams->super_crn_etc1_pack_params).m_quality ==
                        cCRNETCQualitySlow) {
                      bVar14 = evaluate_solution(this,(etc1_solution_coordinates *)&local_b8.field_0
                                                 ,local_98,local_a0);
                    }
                    else {
                      bVar14 = evaluate_solution_fast
                                         (this,(etc1_solution_coordinates *)&local_b8.field_0,
                                          local_98,local_a0);
                    }
                    lVar25 = local_60;
                    if ((bVar14 == false) || (iVar21 = iVar21 + 1, iVar21 == local_68)) break;
                  }
                }
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 != local_80);
          }
          local_88 = local_88 + 1;
        } while (local_88 != local_80);
      }
      local_90 = local_90 + 1;
    } while (local_90 != local_80);
  }
  bVar14 = (this->m_best_solution).m_valid;
  if (bVar14 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    prVar11 = this->m_pResult;
    __src = (this->m_best_solution).m_selectors.m_p;
    prVar11->m_error = (this->m_best_solution).m_error;
    (prVar11->m_block_color_unscaled).field_0.field_0.r =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
    (prVar11->m_block_color_unscaled).field_0.field_0.g =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
    (prVar11->m_block_color_unscaled).field_0.field_0.b =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
    (prVar11->m_block_color_unscaled).field_0.field_0.a =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.a;
    prVar11 = this->m_pResult;
    prVar11->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    prVar11->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(prVar11->m_pSelectors,__src,(ulong)uVar7);
    this->m_pResult->m_n = uVar7;
  }
  return bVar14;
}

Assistant:

bool etc1_optimizer::compute()
    {
        const uint n = m_pParams->m_num_src_pixels;
        const int scan_delta_size = m_pParams->m_scan_delta_size;

        // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
        // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
        for (int zdi = 0; zdi < scan_delta_size; zdi++)
        {
            const int zd = m_pParams->m_pScan_deltas[zdi];
            const int mbb = m_bb + zd;
            if (mbb < 0)
            {
                continue;
            }
            else if (mbb > m_limit)
            {
                break;
            }

            for (int ydi = 0; ydi < scan_delta_size; ydi++)
            {
                const int yd = m_pParams->m_pScan_deltas[ydi];
                const int mbg = m_bg + yd;
                if (mbg < 0)
                {
                    continue;
                }
                else if (mbg > m_limit)
                {
                    break;
                }

                for (int xdi = 0; xdi < scan_delta_size; xdi++)
                {
                    const int xd = m_pParams->m_pScan_deltas[xdi];
                    const int mbr = m_br + xd;
                    if (mbr < 0)
                    {
                        continue;
                    }
                    else if (mbr > m_limit)
                    {
                        break;
                    }

                    etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
                    if (m_pParams->m_quality == cCRNETCQualitySlow)
                    {
                        if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }
                    else
                    {
                        if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
                        {
                            continue;
                        }
                    }

                    // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
                    // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
                    // The goal is:
                    // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
                    // Rearranging this:
                    // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
                    // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
                    // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
                    // So what this means:
                    // optimal_block_color = avg_input - avg_inten_delta
                    // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
                    // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
                    // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

                    const uint max_refinement_trials = (m_pParams->m_quality == cCRNETCQualityFast) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
                    for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
                    {
                        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();
                        const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

                        int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
                        const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
                        for (uint r = 0; r < n; r++)
                        {
                            const uint s = *pSelectors++;
                            const int yd = pInten_table[s];
                            // Compute actual delta being applied to each pixel, taking into account clamping.
                            delta_sum_r += math::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
                            delta_sum_g += math::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
                            delta_sum_b += math::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
                        }
                        if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
                        {
                            break;
                        }
                        const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
                        const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
                        const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
                        const int br1 = math::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bg1 = math::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
                        const int bb1 = math::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

                        bool skip = false;

                        if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
                        {
                            skip = true;
                        }
                        else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
                        {
                            skip = true;
                        }
                        else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
                        {
                            skip = true;
                        }

                        if (skip)
                        {
                            break;
                        }

                        etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
                        if (m_pParams->m_quality == cCRNETCQualitySlow)
                        {
                            if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }
                        else
                        {
                            if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
                            {
                                break;
                            }
                        }

                    } // refinement_trial

                } // xdi
            } // ydi
        } // zdi

        if (!m_best_solution.m_valid)
        {
            m_pResult->m_error = cUINT32_MAX;
            return false;
        }

        const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();

#ifdef CRNLIB_BUILD_DEBUG
        {
            color_quad_u8 block_colors[4];
            m_best_solution.m_coords.get_block_colors(block_colors);

            const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
            uint64 actual_error = 0;
            for (uint i = 0; i < n; i++)
                actual_error += color::elucidian_distance(pSrc_pixels[i], block_colors[pSelectors[i]], false);

            CRNLIB_ASSERT(actual_error == m_best_solution.m_error);
        }
#endif

        m_pResult->m_error = m_best_solution.m_error;

        m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
        m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

        m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
        memcpy(m_pResult->m_pSelectors, pSelectors, n);
        m_pResult->m_n = n;

        return true;
    }